

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinExtVar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  iterator iVar1;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  AST *pAVar2;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar3;
  AST *expr;
  string msg;
  Tokens tokens;
  string var8;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&var8,"extVar",(allocator<char> *)&tokens);
  msg._M_dataplus._M_p._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&msg;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_30,__l,in_RCX);
  validateBuiltinArgs(this,loc,&var8,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_30);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_30);
  std::__cxx11::string::~string((string *)&var8);
  encode_utf8(&var8,(UString *)
                    ((((args->
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
          ::find(&(this->externalVars)._M_t,&var8);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->externalVars)._M_t._M_impl.super__Rb_tree_header)
  {
    if ((char)iVar1._M_node[3]._M_color == _S_black) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokens,
                     "<extvar:",&var8);
      std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tokens,">");
      std::__cxx11::string::~string((string *)&tokens);
      jsonnet_lex(&tokens,&msg,*(char **)(iVar1._M_node + 2));
      expr = jsonnet_parse(this->alloc,&tokens);
      jsonnet_desugar(this->alloc,&expr,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                       *)0x0);
      jsonnet_static_analysis(expr);
      Stack::pop(&this->stack);
      pAVar2 = expr;
      std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
      ::_M_clear(&tokens.
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                );
      std::__cxx11::string::~string((string *)&msg);
    }
    else {
      decode_utf8((UString *)&msg,(string *)(iVar1._M_node + 2));
      VVar3 = makeString(this,(UString *)&msg);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar3._0_8_;
      std::__cxx11::u32string::~u32string((u32string *)&msg);
      pAVar2 = (AST *)0x0;
    }
    std::__cxx11::string::~string((string *)&var8);
    return pAVar2;
  }
  std::operator+(&msg,"undefined external variable: ",&var8);
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,&msg);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinExtVar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "extVar", args, {Value::STRING});
        const UString &var = static_cast<HeapString *>(args[0].v.h)->value;
        std::string var8 = encode_utf8(var);
        auto it = externalVars.find(var8);
        if (it == externalVars.end()) {
            std::string msg = "undefined external variable: " + var8;
            throw makeError(loc, msg);
        }
        const VmExt &ext = it->second;
        if (ext.isCode) {
            std::string filename = "<extvar:" + var8 + ">";
            Tokens tokens = jsonnet_lex(filename, ext.data.c_str());
            AST *expr = jsonnet_parse(alloc, tokens);
            jsonnet_desugar(alloc, expr, nullptr);
            jsonnet_static_analysis(expr);
            stack.pop();
            return expr;
        } else {
            scratch = makeString(decode_utf8(ext.data));
            return nullptr;
        }
    }